

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstHelper.hpp
# Opt level: O0

TermList Kernel::SubstHelper::applyImpl<false,Shell::EqResWithDeletion>
                   (TermList trm,EqResWithDeletion *applicator,bool noSharing)

{
  bool bVar1;
  EqResWithDeletion *in_RSI;
  undefined1 in_stack_0000042f;
  EqResWithDeletion *in_stack_00000430;
  Term *in_stack_00000438;
  Term *in_stack_ffffffffffffffc8;
  TermList *in_stack_ffffffffffffffd0;
  TermList local_10;
  uint64_t local_8;
  
  bVar1 = TermList::isOrdinaryVar((TermList *)0xb8e390);
  if (bVar1) {
    TermList::var(&local_10);
    local_8 = (uint64_t)
              Shell::EqResWithDeletion::apply
                        (in_RSI,(uint)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  }
  else {
    bVar1 = TermList::isSpecialVar((TermList *)0xb8e3c7);
    if (bVar1) {
      TermList::var(&local_10);
      local_8 = (uint64_t)
                SubstHelper_Aux::SpecVarHandler<false>::apply<Shell::EqResWithDeletion>
                          ((EqResWithDeletion *)in_stack_ffffffffffffffc8,0);
    }
    else {
      TermList::term((TermList *)0xb8e3fe);
      applyImpl<false,Shell::EqResWithDeletion>
                (in_stack_00000438,in_stack_00000430,(bool)in_stack_0000042f);
      TermList::TermList(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
  }
  return (TermList)local_8;
}

Assistant:

TermList SubstHelper::applyImpl(TermList trm, Applicator& applicator, bool noSharing)
{
  using namespace SubstHelper_Aux;

  if(trm.isOrdinaryVar()) {
    return applicator.apply(trm.var());
  }
  else if(trm.isSpecialVar()) {
    return SpecVarHandler<ProcessSpecVars>::apply(applicator, trm.var());
  }
  else {
    ASS(trm.isTerm());
    return TermList(applyImpl<ProcessSpecVars>(trm.term(), applicator, noSharing));
  }
}